

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.h
# Opt level: O2

uint32_t mpack_node_data_len(mpack_node_t node)

{
  uint32_t uVar1;
  
  uVar1 = 0;
  if ((node.tree)->error == mpack_ok) {
    if ((node.data)->type - mpack_type_str < 3) {
      uVar1 = (node.data)->len;
    }
    else {
      mpack_tree_flag_error(node.tree,mpack_error_type);
      uVar1 = 0;
    }
  }
  return uVar1;
}

Assistant:

MPACK_INLINE uint32_t mpack_node_data_len(mpack_node_t node) {
    if (mpack_node_error(node) != mpack_ok)
        return 0;

    mpack_type_t type = node.data->type;
    if (type == mpack_type_str || type == mpack_type_bin || type == mpack_type_ext)
        return (uint32_t)node.data->len;

    mpack_node_flag_error(node, mpack_error_type);
    return 0;
}